

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::SourceCodeInfo_Location::SharedDtor(MessageLite *self)

{
  Arena *pAVar1;
  LogMessage *pLVar2;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  SourceCodeInfo_Location *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (SourceCodeInfo_Location *)self;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  pAVar1 = MessageLite::GetArena(local_18);
  if (pAVar1 == (Arena *)0x0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(local_18 + 6));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&local_18[6]._internal_metadata_);
    Impl_::~Impl_((Impl_ *)(local_18 + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x389b,"this_.GetArena() == nullptr");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void SourceCodeInfo_Location::SharedDtor(MessageLite& self) {
  SourceCodeInfo_Location& this_ = static_cast<SourceCodeInfo_Location&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.leading_comments_.Destroy();
  this_._impl_.trailing_comments_.Destroy();
  this_._impl_.~Impl_();
}